

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndirectObjectsReferenceRegistry.cpp
# Opt level: O1

EStatusCode __thiscall
IndirectObjectsReferenceRegistry::DeleteObject
          (IndirectObjectsReferenceRegistry *this,ObjectIDType inObjectID)

{
  pointer pOVar1;
  Trace *this_00;
  char *inFormat;
  
  pOVar1 = (this->mObjectsWritesRegistry).
           super__Vector_base<ObjectWriteInformation,_std::allocator<ObjectWriteInformation>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (inObjectID <
      (ulong)((long)(this->mObjectsWritesRegistry).
                    super__Vector_base<ObjectWriteInformation,_std::allocator<ObjectWriteInformation>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar1 >> 5)) {
    if (pOVar1[inObjectID].mGenerationNumber != 0xffff) {
      pOVar1[inObjectID].mIsDirty = true;
      pOVar1[inObjectID].mGenerationNumber = pOVar1[inObjectID].mGenerationNumber + 1;
      pOVar1[inObjectID].mWritePosition = 0;
      pOVar1[inObjectID].mObjectReferenceType = Free;
      return eSuccess;
    }
    this_00 = Trace::DefaultTrace();
    inFormat = 
    "IndirectObjectsReferenceRegistry::DeleteObject, object ID generation number reached maximum value and cannot be increased. ID = %ld"
    ;
  }
  else {
    this_00 = Trace::DefaultTrace();
    inFormat = 
    "IndirectObjectsReferenceRegistry::DeleteObject, Out of range failure. An Object ID is marked for delete,but there\'s no such object. ID = %ld"
    ;
  }
  Trace::TraceToLog(this_00,inFormat,inObjectID);
  return eFailure;
}

Assistant:

PDFHummus::EStatusCode IndirectObjectsReferenceRegistry::DeleteObject(ObjectIDType inObjectID)
{
	if(mObjectsWritesRegistry.size() <= inObjectID)
	{
		TRACE_LOG1("IndirectObjectsReferenceRegistry::DeleteObject, Out of range failure. An Object ID is marked for delete,but there's no such object. ID = %ld",inObjectID);
		return PDFHummus::eFailure; 
	}

    if(mObjectsWritesRegistry[inObjectID].mGenerationNumber == 65535)
    {
		TRACE_LOG1("IndirectObjectsReferenceRegistry::DeleteObject, object ID generation number reached maximum value and cannot be increased. ID = %ld",inObjectID);
		return PDFHummus::eFailure; 
        
    }
    
    mObjectsWritesRegistry[inObjectID].mIsDirty = true;
    ++(mObjectsWritesRegistry[inObjectID].mGenerationNumber);
    mObjectsWritesRegistry[inObjectID].mWritePosition = 0;
    mObjectsWritesRegistry[inObjectID].mObjectReferenceType = ObjectWriteInformation::Free;
    
    return PDFHummus::eSuccess;
}